

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void deinterlace_row(png_bytep buffer,png_const_bytep row,uint pixel_size,png_uint_32 w,int pass,
                    int littleendian)

{
  int iVar1;
  png_uint_32 fromIndex;
  png_uint_32 toIndex;
  
  toIndex = (pass & 1U) << (3U - (char)(pass + 1U >> 1) & 0x1f) & 7;
  iVar1 = 8;
  if (1 < pass) {
    iVar1 = 1 << ((byte)(7U - pass >> 1) & 0x1f);
  }
  if (toIndex < w) {
    fromIndex = 0;
    do {
      pixel_copy(buffer,toIndex,row,fromIndex,pixel_size,littleendian);
      fromIndex = fromIndex + 1;
      toIndex = toIndex + iVar1;
    } while (toIndex < w);
  }
  return;
}

Assistant:

static void
deinterlace_row(png_bytep buffer, png_const_bytep row,
   unsigned int pixel_size, png_uint_32 w, int pass, int littleendian)
{
   /* The inverse of the above, 'row' is part of row 'y' of the output image,
    * in 'buffer'.  The image is 'w' wide and this is pass 'pass', distribute
    * the pixels of row into buffer and return the number written (to allow
    * this to be checked).
    */
   png_uint_32 xin, xout, xstep;

   xout = PNG_PASS_START_COL(pass);
   xstep = 1U<<PNG_PASS_COL_SHIFT(pass);

   for (xin=0; xout<w; xout+=xstep)
   {
      pixel_copy(buffer, xout, row, xin, pixel_size, littleendian);
      ++xin;
   }
}